

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lratchecker.cpp
# Opt level: O2

void __thiscall
CaDiCaL::LratChecker::delete_clause
          (LratChecker *this,uint64_t id,bool param_2,vector<int,_std::allocator<int>_> *c)

{
  int64_t *piVar1;
  uint uVar2;
  Internal *pIVar3;
  LratCheckerClause *pLVar4;
  uint *puVar5;
  pointer piVar6;
  uint uVar7;
  int *lit;
  LratCheckerClause **ppLVar8;
  uint *puVar9;
  uint64_t uVar10;
  ulong uVar11;
  int *lit_3;
  int *lit_1;
  double s;
  double s_00;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  
  pIVar3 = this->internal;
  if ((pIVar3->profiles).checking.level <= (pIVar3->opts).profile) {
    Internal::time(pIVar3,(time_t *)id);
    Internal::start_profiling(pIVar3,&(pIVar3->profiles).checking,s);
  }
  piVar1 = &(this->stats).deleted;
  *piVar1 = *piVar1 + 1;
  import_clause(this,c);
  this->last_id = id;
  ppLVar8 = find(this,id);
  pLVar4 = *ppLVar8;
  if (pLVar4 == (LratCheckerClause *)0x0) {
    fatal_message_start();
    fputs("deleted clause not in proof:\n",_stderr);
    puVar5 = (uint *)(this->imported_clause).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish;
    for (puVar9 = (uint *)(this->imported_clause).super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start; puVar9 != puVar5;
        puVar9 = puVar9 + 1) {
      fprintf(_stderr,"%d ",(ulong)*puVar9);
    }
    id = (uint64_t)_stderr;
    fputc(0x30,_stderr);
    fatal_message_end();
  }
  else {
    puVar5 = (uint *)(this->imported_clause).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish;
    for (puVar9 = (uint *)(this->imported_clause).super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start; puVar9 != puVar5;
        puVar9 = puVar9 + 1) {
      uVar2 = *puVar9;
      uVar7 = -uVar2;
      if (0 < (int)uVar2) {
        uVar7 = uVar2;
      }
      id = (uint64_t)
           (this->marks).super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
           super__Vector_impl_data._M_start;
      *(undefined1 *)((long)&((FILE *)id)->_flags + (ulong)(~(~uVar2 >> 0x1f) + uVar7 * 2)) = 1;
    }
    for (uVar11 = 0; uVar11 < pLVar4->size; uVar11 = uVar11 + 1) {
      uVar2 = pLVar4->literals[uVar11];
      uVar7 = -uVar2;
      if (0 < (int)uVar2) {
        uVar7 = uVar2;
      }
      if ((this->marks).super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
          super__Vector_impl_data._M_start[~(~uVar2 >> 0x1f) + uVar7 * 2] == '\0') {
        fatal_message_start();
        fputs("deleted clause not in proof:\n",_stderr);
        puVar5 = (uint *)(this->imported_clause).super__Vector_base<int,_std::allocator<int>_>.
                         _M_impl.super__Vector_impl_data._M_finish;
        for (puVar9 = (uint *)(this->imported_clause).super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_start; puVar9 != puVar5;
            puVar9 = puVar9 + 1) {
          fprintf(_stderr,"%d ",(ulong)*puVar9);
        }
        id = (uint64_t)_stderr;
        fputc(0x30,_stderr);
        fatal_message_end();
      }
    }
    puVar5 = (uint *)(this->imported_clause).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish;
    for (puVar9 = (uint *)(this->imported_clause).super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start; puVar9 != puVar5;
        puVar9 = puVar9 + 1) {
      uVar2 = *puVar9;
      uVar7 = -uVar2;
      if (0 < (int)uVar2) {
        uVar7 = uVar2;
      }
      id = (uint64_t)
           (this->marks).super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
           super__Vector_impl_data._M_start;
      *(undefined1 *)((long)&((FILE *)id)->_flags + (ulong)(~(~uVar2 >> 0x1f) + uVar7 * 2)) = 0;
    }
    uVar10 = this->num_garbage + 1;
    this->num_garbage = uVar10;
    this->num_clauses = this->num_clauses - 1;
    *ppLVar8 = pLVar4->next;
    pLVar4->next = this->garbage;
    this->garbage = pLVar4;
    pLVar4->garbage = true;
    auVar12._8_4_ = (int)(uVar10 >> 0x20);
    auVar12._0_8_ = uVar10;
    auVar12._12_4_ = 0x45300000;
    uVar11 = this->size_vars;
    if ((ulong)this->size_vars < this->size_clauses) {
      uVar11 = this->size_clauses;
    }
    auVar13._8_4_ = (int)(uVar11 >> 0x20);
    auVar13._0_8_ = uVar11;
    auVar13._12_4_ = 0x45300000;
    if (((auVar13._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)uVar11) - 4503599627370496.0)) * 0.5 <
        (auVar12._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)uVar10) - 4503599627370496.0)) {
      collect_garbage_clauses(this);
    }
  }
  piVar6 = (this->imported_clause).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->imported_clause).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar6) {
    (this->imported_clause).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar6;
  }
  pIVar3 = this->internal;
  if ((pIVar3->opts).profile < (pIVar3->profiles).checking.level) {
    return;
  }
  Internal::time(pIVar3,(time_t *)id);
  Internal::stop_profiling(pIVar3,&(pIVar3->profiles).checking,s_00);
  return;
}

Assistant:

void LratChecker::delete_clause (uint64_t id, bool, const vector<int> &c) {
  START (checking);
  LOG (c, "LRAT CHECKER checking deletion of clause[%" PRIu64 "]", id);
  stats.deleted++;
  import_clause (c);
  last_id = id;
  LratCheckerClause **p = find (id), *d = *p;
  if (d) {
    for (const auto &lit : imported_clause)
      mark (lit) = true;
    const int *dp = d->literals;
    for (unsigned i = 0; i < d->size; i++) {
      int lit = *(dp + i);
      if (!mark (lit)) {        // should never happen since ids
        fatal_message_start (); // are unique.
        fputs ("deleted clause not in proof:\n", stderr);
        for (const auto &lit : imported_clause)
          fprintf (stderr, "%d ", lit);
        fputc ('0', stderr);
        fatal_message_end ();
      }
    }
    for (const auto &lit : imported_clause)
      mark (lit) = false;

    // Remove from hash table, mark as garbage, connect to garbage list.
    num_garbage++;
    assert (num_clauses);
    num_clauses--;
    *p = d->next;
    d->next = garbage;
    garbage = d;
    d->garbage = true;

    // If there are enough garbage clauses collect them.
    // TODO: probably can just delete clause directly without
    // specific garbage collection phase.
    if (num_garbage > 0.5 * max ((size_t) size_clauses, (size_t) size_vars))
      collect_garbage_clauses ();
  } else {
    fatal_message_start ();
    fputs ("deleted clause not in proof:\n", stderr);
    for (const auto &lit : imported_clause)
      fprintf (stderr, "%d ", lit);
    fputc ('0', stderr);
    fatal_message_end ();
  }
  imported_clause.clear ();
  STOP (checking);
}